

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

int Gia_ManEvalWindowInc
              (Gia_Man_t *p,Vec_Int_t *vLeaves,Vec_Int_t *vNodes,Vec_Wec_t *vWin,Vec_Int_t *vTemp,
              int fUseTwo)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if (vNodes->nSize != vWin->nSize) {
    __assert_fail("Vec_IntSize(vNodes) == Vec_WecSize(vWin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                  ,0x26b,
                  "int Gia_ManEvalWindowInc(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, int)"
                 );
  }
  Gia_ManUpdateMapping(p,vNodes,vWin);
  Gia_ManCollectTfo(p,vLeaves,vTemp);
  iVar5 = vTemp->nSize;
  if (1 < iVar5) {
    piVar2 = vTemp->pArray;
    iVar3 = -1;
    lVar4 = 0;
    do {
      iVar1 = piVar2[lVar4];
      piVar2[lVar4] = piVar2[iVar5 + iVar3];
      piVar2[vTemp->nSize + iVar3] = iVar1;
      lVar4 = lVar4 + 1;
      iVar5 = vTemp->nSize;
      iVar3 = iVar3 + -1;
    } while (lVar4 < iVar5 / 2);
  }
  if (vTemp->nSize < 1) {
    iVar5 = 0;
  }
  else {
    lVar4 = 0;
    iVar5 = 0;
    do {
      iVar3 = vTemp->pArray[lVar4];
      if (((long)iVar3 < 0) || (p->vMapping->nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((p->vMapping->pArray[iVar3] != 0) &&
         (iVar3 = Gia_ObjComputeEdgeDelay(p,iVar3,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo),
         iVar5 <= iVar3)) {
        iVar5 = iVar3;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < vTemp->nSize);
  }
  Gia_ManUpdateMapping(p,vNodes,vWin);
  return iVar5;
}

Assistant:

int Gia_ManEvalWindowInc( Gia_Man_t * p, Vec_Int_t * vLeaves, Vec_Int_t * vNodes, Vec_Wec_t * vWin, Vec_Int_t * vTemp, int fUseTwo )
{
    int i, iLut, Delay, DelayMax = 0;
    assert( Vec_IntSize(vNodes) == Vec_WecSize(vWin) );
    Gia_ManUpdateMapping( p, vNodes, vWin );
    Gia_ManCollectTfo( p, vLeaves, vTemp );
    Vec_IntReverseOrder( vTemp );
    Vec_IntForEachEntry( vTemp, iLut, i )
    {
        if ( !Gia_ObjIsLut(p, iLut) )
            continue;
        Delay = Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    Gia_ManUpdateMapping( p, vNodes, vWin );
    return DelayMax;
}